

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_misc.c
# Opt level: O0

int lj_cf_misc_memprof_start(lua_State *L)

{
  uint uVar1;
  long lVar2;
  uint32_t uVar3;
  int status;
  GCstr *pGVar4;
  lua_State *L_00;
  long in_RDI;
  int memprof_status;
  profile_ctx *ctx;
  char *fname;
  GCstr *s;
  lj_memprof_options opt;
  char *L_01;
  uint in_stack_ffffffffffffff90;
  GCSize in_stack_ffffffffffffff94;
  void *in_stack_ffffffffffffff98;
  lua_State *in_stack_ffffffffffffffa0;
  lua_State *__file;
  lua_State *opt_00;
  lua_State *L_02;
  int local_1c;
  
  memset(&stack0xffffffffffffffb0,0,0x28);
  pGVar4 = lj_lib_optstr(in_stack_ffffffffffffffa0,(int)((ulong)in_stack_ffffffffffffff98 >> 0x20));
  if (pGVar4 == (GCstr *)0x0) {
    L_01 = "memprof.bin";
  }
  else {
    L_01 = (char *)(pGVar4 + 1);
  }
  __file = (lua_State *)L_01;
  L_00 = (lua_State *)
         lj_mem_realloc((lua_State *)L_01,in_stack_ffffffffffffff98,in_stack_ffffffffffffff94,
                        in_stack_ffffffffffffff90);
  L_02 = (lua_State *)&L_00->base;
  uVar1 = *(uint *)(in_RDI + 8);
  L_00->glref = (MRef)(int)(ulong)uVar1;
  L_00->gclist = (GCRef)(int)((ulong)uVar1 >> 0x20);
  opt_00 = L_00;
  uVar3 = open64((char *)__file,0x241,0x1a4);
  (L_00->nextgc).gcptr32 = uVar3;
  if ((L_00->nextgc).gcptr32 == 0xffffffff) {
    lVar2 = *(long *)&L_00->glref;
    *(int *)(lVar2 + 0x50) = *(int *)(lVar2 + 0x50) + -0x800010;
    *(long *)(lVar2 + 0x90) = *(long *)(lVar2 + 0x90) + 0x800010;
    (**(code **)(lVar2 + 0x40))(*(undefined8 *)(lVar2 + 0x48),L_00,0x800010,0);
    local_1c = prof_error(L_00,in_stack_ffffffffffffff94,L_01);
  }
  else {
    status = lj_memprof_start(L_02,(lj_memprof_options *)opt_00);
    if (status == 0) {
      lua_pushboolean((lua_State *)(ulong)in_stack_ffffffffffffff90,(int)((ulong)L_01 >> 0x20));
      local_1c = 1;
    }
    else {
      local_1c = prof_error(L_00,status,L_01);
    }
  }
  return local_1c;
}

Assistant:

LJLIB_CF(misc_memprof_start)
{
#if !LJ_HASMEMPROF
  const char *err_details = err2msg(LJ_ERR_PROF_DETAILS_DISABLED);
  return prof_error(L, PROFILE_ERRUSE, err_details);
#else
  struct lj_memprof_options opt = {0};
  GCstr *s = lj_lib_optstr(L, 1);
  const char *fname = s ? strdata(s) : MEMPROF_DEFAULT_OUTPUT;
  struct profile_ctx *ctx;
  int memprof_status;

  /*
  ** FIXME: more elegant solution with ctx.
  ** Throws in case of OOM.
  */
  ctx = lj_mem_new(L, sizeof(*ctx));
  opt.ctx = ctx;
  opt.buf = ctx->buf;
  opt.writer = buffer_writer_default;
  opt.on_stop = on_stop_cb_default;
  opt.len = STREAM_BUFFER_SIZE;

  ctx->g = G(L);
  ctx->fd = open(fname, O_CREAT | O_WRONLY | O_TRUNC, 0644);

  if (ctx->fd == -1) {
    lj_mem_free(ctx->g, ctx, sizeof(*ctx));
    return prof_error(L, PROFILE_ERRIO, fname);
  }

  memprof_status = lj_memprof_start(L, &opt);
  if (LJ_UNLIKELY(memprof_status != PROFILE_SUCCESS))
    return prof_error(L, memprof_status, NULL);

  lua_pushboolean(L, 1);
  return 1;
#endif /* !LJ_HASMEMPROF */
}